

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase_Test::testBody
          (TEST_MemoryLeakDetectorTest_IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase_Test
           *this)

{
  MemoryLeakDetector *pMVar1;
  TestMemoryAllocator *pTVar2;
  char *pcVar3;
  char *pcVar4;
  UtestShell *pUVar5;
  size_t sVar6;
  TestTerminator *pTVar7;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewAllocator();
  pcVar3 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,4,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewAllocator();
  pcVar4 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,8,false);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,sVar6,
             "LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x124,pTVar7);
  MemoryLeakDetector::clearAllAccounting
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
             mem_leak_period_checking);
  (*PlatformSpecificFree)(pcVar3);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,0,sVar6,
             "LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x127,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,sVar6,"LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x128,pTVar7);
  MemoryLeakDetector::startChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewAllocator();
  pcVar3 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,4,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,sVar6,
             "LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x12d,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,2,sVar6,"LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x12e,pTVar7);
  MemoryLeakDetector::clearAllAccounting
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
             mem_leak_period_checking);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,0,sVar6,
             "LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x131,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,sVar6,"LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x132,pTVar7);
  MemoryLeakDetector::clearAllAccounting
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
             mem_leak_period_all);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,0,sVar6,"LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x135,pTVar7);
  (*PlatformSpecificFree)(pcVar4);
  (*PlatformSpecificFree)(pcVar3);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    detector->stopChecking();

    char* mem2 = detector->allocMemory(defaultNewAllocator(), 8);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    detector->clearAllAccounting(mem_leak_period_checking);
    PlatformSpecificFree(mem);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));

    detector->startChecking();
    char* mem3 = detector->allocMemory(defaultNewAllocator(), 4);
    detector->stopChecking();
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all));

    detector->clearAllAccounting(mem_leak_period_checking);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));

    detector->clearAllAccounting(mem_leak_period_all);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_all));
    PlatformSpecificFree(mem2);
    PlatformSpecificFree(mem3);
}